

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O3

Node * __thiscall itis::SplayTree::search(SplayTree *this,int x)

{
  Node *pNVar1;
  Node *x_00;
  long lVar2;
  Node *pNVar3;
  
  if (this->root == (Node *)0x0) {
    pNVar3 = (Node *)0x0;
  }
  else {
    pNVar1 = this->root;
    do {
      x_00 = pNVar1;
      lVar2 = 0x10;
      if ((x_00->data <= x) && (lVar2 = 0x18, pNVar3 = x_00, x <= x_00->data)) break;
      pNVar1 = *(Node **)((long)&x_00->data + lVar2);
      pNVar3 = (Node *)0x0;
    } while (pNVar1 != (Node *)0x0);
    splay(this,x_00);
  }
  return pNVar3;
}

Assistant:

Node *SplayTree::search(int x) {
    Node *ret = nullptr;
    Node *curr = this->root;
    Node *prev = nullptr;
    while (curr != nullptr) {
      prev = curr;
      if (x < curr->data) {
        curr = curr->left_child;
      } else if (x > curr->data) {
        curr = curr->right_child;
      } else {
        ret = curr;
        break;
      }
    }
    if (ret != nullptr) {
      splay(ret);
    } else if (prev != nullptr) {
      splay(prev);
    }
    return ret;
  }